

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

IsMineResult
wallet::anon_unknown_1::IsMineInner
          (LegacyDataSPKM *keystore,CScript *scriptPubKey,IsMineSigVersion sigversion,
          bool recurse_scripthash)

{
  pointer pbVar1;
  pointer puVar2;
  uchar *data;
  undefined8 uVar3;
  bool bVar4;
  TxoutType TVar5;
  uint uVar6;
  int iVar7;
  IsMineResult IVar8;
  long *plVar9;
  CScript *pCVar10;
  CRIPEMD160 *this;
  long lVar11;
  IsMineResult IVar12;
  byte bVar13;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  uint160 result;
  CScriptID scriptID_1;
  CScriptID scriptID;
  CKeyID keyID;
  CScript subscript;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_138;
  char *local_118;
  long lStack_110;
  undefined4 local_108;
  direct_or_indirect local_f8;
  uint local_dc;
  undefined1 local_d8 [28];
  uint uStack_bc;
  char *local_b8;
  long lStack_b0;
  uchar local_a8 [16];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_98;
  undefined1 local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_138.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar5 = Solver(scriptPubKey,&local_138);
  local_b8 = (char *)0x0;
  lStack_b0 = 0;
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  IVar12 = NO;
  switch(TVar5) {
  case PUBKEY:
    CPubKey::Set<unsigned_char_const*>
              ((CPubKey *)&local_98._M_first,
               ((local_138.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
               ((local_138.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    CPubKey::GetID((CKeyID *)local_d8,(CPubKey *)&local_98._M_first);
    uVar3 = local_d8._16_8_;
    local_a8[0] = local_d8[0x10];
    local_a8[1] = local_d8[0x11];
    local_a8[2] = local_d8[0x12];
    local_a8[3] = local_d8[0x13];
    local_b8 = (char *)local_d8._0_8_;
    lStack_b0 = local_d8._8_8_;
    local_d8._16_8_ = uVar3;
    if ((P2SH < sigversion) &&
       (IVar12 = INVALID,
       (long)((local_138.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)((local_138.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start != 0x21)) goto LAB_004d33de;
    uVar6 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1d])(keystore,&local_b8);
    goto LAB_004d3056;
  case PUBKEYHASH:
    puVar2 = ((local_138.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((local_138.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar2 != 0x14) {
LAB_004d3427:
      __assert_fail("vch.size() == WIDTH",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/uint256.h"
                    ,0x2a,"base_blob<160>::base_blob(Span<const unsigned char>) [BITS = 160]");
    }
    memcpy(&local_98,puVar2,0x14);
    uVar3 = local_98._16_8_;
    local_b8 = (char *)local_98._0_8_;
    lStack_b0 = local_98._8_8_;
    local_a8[0] = local_98._M_first._M_storage._M_storage[0x10];
    local_a8[1] = local_98._M_first._M_storage._M_storage[0x11];
    local_a8[2] = local_98._M_first._M_storage._M_storage[0x12];
    local_a8[3] = local_98._M_first._M_storage._M_storage[0x13];
    local_98._16_8_ = uVar3;
    if (P2SH < sigversion) {
      local_98._M_first._M_storage._M_storage[0] = 0xff;
      iVar7 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1f])(keystore,&local_b8);
      if (((char)iVar7 != '\0') && ((local_98._M_first._M_storage._M_storage[0] & 0xfe) != 2)) {
LAB_004d341f:
        IVar12 = INVALID;
        goto LAB_004d33de;
      }
    }
    uVar6 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1d])(keystore,&local_b8);
LAB_004d3056:
    IVar12 = (uVar6 & 0xff) * 2;
    break;
  case SCRIPTHASH:
    IVar12 = INVALID;
    if (sigversion != TOP) goto LAB_004d33de;
    puVar2 = ((local_138.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((local_138.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar2 != 0x14) goto LAB_004d3427;
    memcpy(&local_98,puVar2,0x14);
    local_d8._0_8_ = local_98._0_8_;
    local_d8._8_8_ = local_98._8_8_;
    local_d8._16_4_ = local_98._16_4_;
    local_98._16_8_ = 0;
    local_98._24_8_ = 0;
    local_98._0_8_ = (void *)0x0;
    local_98._8_8_ = 0;
    iVar7 = (*(keystore->super_FillableSigningProvider).super_SigningProvider._vptr_SigningProvider
              [2])(&keystore->super_FillableSigningProvider,local_d8,&local_98);
    IVar12 = NO;
    if ((char)iVar7 != '\0') {
      IVar8 = SPENDABLE;
      if (recurse_scripthash) {
        IVar8 = IsMineInner(keystore,(CScript *)&local_98._M_first,P2SH,true);
      }
LAB_004d3397:
      IVar12 = NO;
      if (0 < (int)IVar8) {
        IVar12 = IVar8;
      }
    }
LAB_004d33a0:
    if (0x1c < (uint)local_98._28_4_) {
      free((void *)local_98._0_8_);
      local_98._0_8_ = (void *)0x0;
    }
    break;
  case MULTISIG:
    IVar12 = NO;
    if (sigversion != TOP) {
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      vector<__gnu_cxx::__normal_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,void>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&local_98._M_first,
                 local_138.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,
                 local_138.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,(allocator_type *)local_d8);
      if ((sigversion != P2SH) && (local_98._8_8_ - local_98._0_8_ != 0)) {
        lVar11 = ((long)(local_98._8_8_ - local_98._0_8_) >> 3) * -0x5555555555555555;
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        plVar9 = (long *)(local_98._0_8_ + 8);
        do {
          if (*plVar9 - plVar9[-1] != 0x21) {
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&local_98._M_first);
            goto LAB_004d341f;
          }
          plVar9 = plVar9 + 3;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      bVar4 = HaveKeys((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_98._M_first,keystore);
      IVar12 = (uint)bVar4 * 2;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)&local_98._M_first);
    }
    break;
  case WITNESS_V0_SCRIPTHASH:
    IVar12 = INVALID;
    if (sigversion == WITNESS_V0) goto LAB_004d33de;
    if (sigversion == TOP) {
      local_d8._16_8_ = 0;
      stack0xffffffffffffff40 = 0;
      local_d8._0_8_ = (char *)0x0;
      local_d8._8_8_ = 0;
      local_f8.indirect_contents.indirect = (char *)((ulong)(uint7)local_f8._1_7_ << 8);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_d8,(iterator)local_d8,
                 (uchar *)local_f8.direct);
      pbVar1 = ((local_138.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      b_00._M_extent._M_extent_value =
           (long)((local_138.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pbVar1;
      b_00._M_ptr = pbVar1;
      pCVar10 = CScript::operator<<((CScript *)local_d8,b_00);
      CScriptID::CScriptID((CScriptID *)&local_98._M_first,pCVar10);
      iVar7 = (*(keystore->super_FillableSigningProvider).super_SigningProvider.
                _vptr_SigningProvider[3])(&keystore->super_FillableSigningProvider,&local_98);
      bVar13 = (byte)iVar7 ^ 1;
      if (0x1c < uStack_bc) {
        free((void *)local_d8._0_8_);
        local_d8._0_8_ = (char *)0x0;
      }
    }
    else {
      bVar13 = 0;
    }
    if (bVar13 == 0) {
      data = ((local_138.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
      puVar2 = ((local_138.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_118 = (char *)0x0;
      lStack_110 = 0;
      local_108 = 0;
      CRIPEMD160::CRIPEMD160((CRIPEMD160 *)&local_98._M_first);
      this = CRIPEMD160::Write((CRIPEMD160 *)&local_98._M_first,data,(long)puVar2 - (long)data);
      CRIPEMD160::Finalize(this,(uchar *)&local_118);
      local_f8.indirect_contents.indirect = local_118;
      local_f8._8_8_ = lStack_110;
      local_f8._16_4_ = local_108;
      local_98._16_8_ = 0;
      local_98._24_8_ = 0;
      local_98._0_8_ = (void *)0x0;
      local_98._8_8_ = 0;
      iVar7 = (*(keystore->super_FillableSigningProvider).super_SigningProvider.
                _vptr_SigningProvider[2])(&keystore->super_FillableSigningProvider);
      IVar12 = NO;
      if ((char)iVar7 != '\0') {
        IVar8 = SPENDABLE;
        if (recurse_scripthash) {
          IVar8 = IsMineInner(keystore,(CScript *)&local_98._M_first,WITNESS_V0,true);
        }
        goto LAB_004d3397;
      }
      goto LAB_004d33a0;
    }
LAB_004d32e8:
    IVar12 = NO;
    break;
  case WITNESS_V0_KEYHASH:
    IVar12 = INVALID;
    if (sigversion == WITNESS_V0) goto LAB_004d33de;
    if (sigversion == TOP) {
      local_d8._16_8_ = 0;
      stack0xffffffffffffff40 = 0;
      local_d8._0_8_ = (char *)0x0;
      local_d8._8_8_ = 0;
      local_f8.indirect_contents.indirect = (char *)((ulong)(uint7)local_f8._1_7_ << 8);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_d8,(iterator)local_d8,
                 (uchar *)local_f8.direct);
      pbVar1 = ((local_138.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      b._M_extent._M_extent_value =
           (long)((local_138.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pbVar1;
      b._M_ptr = pbVar1;
      pCVar10 = CScript::operator<<((CScript *)local_d8,b);
      CScriptID::CScriptID((CScriptID *)&local_98._M_first,pCVar10);
      iVar7 = (*(keystore->super_FillableSigningProvider).super_SigningProvider.
                _vptr_SigningProvider[3])(&keystore->super_FillableSigningProvider,&local_98);
      bVar13 = (byte)iVar7 ^ 1;
      if (0x1c < uStack_bc) {
        free((void *)local_d8._0_8_);
        local_d8._0_8_ = (char *)0x0;
      }
    }
    else {
      bVar13 = 0;
    }
    if (bVar13 != 0) goto LAB_004d32e8;
    puVar2 = ((local_138.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((local_138.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar2 != 0x14) goto LAB_004d3427;
    memcpy(&local_118,puVar2,0x14);
    local_98._0_8_ = local_118;
    local_98._8_8_ = lStack_110;
    local_98._16_4_ = local_108;
    local_50 = 2;
    GetScriptForDestination
              ((CScript *)&local_f8.indirect_contents,(CTxDestination *)&local_98._M_first);
    IVar8 = IsMineInner(keystore,(CScript *)&local_f8.indirect_contents,WITNESS_V0,true);
    IVar12 = NO;
    if (0 < (int)IVar8) {
      IVar12 = IVar8;
    }
    if (0x1c < local_dc) {
      free(local_f8.indirect_contents.indirect);
      local_f8.indirect_contents.indirect = (char *)0x0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_98._M_first);
  }
  if ((IVar12 == NO) && (bVar4 = LegacyDataSPKM::HaveWatchOnly(keystore,scriptPubKey), bVar4)) {
    IVar12 = WATCH_ONLY;
  }
LAB_004d33de:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return IVar12;
  }
  __stack_chk_fail();
}

Assistant:

IsMineResult IsMineInner(const LegacyDataSPKM& keystore, const CScript& scriptPubKey, IsMineSigVersion sigversion, bool recurse_scripthash=true)
{
    IsMineResult ret = IsMineResult::NO;

    std::vector<valtype> vSolutions;
    TxoutType whichType = Solver(scriptPubKey, vSolutions);

    CKeyID keyID;
    switch (whichType) {
    case TxoutType::NONSTANDARD:
    case TxoutType::NULL_DATA:
    case TxoutType::WITNESS_UNKNOWN:
    case TxoutType::WITNESS_V1_TAPROOT:
    case TxoutType::ANCHOR:
        break;
    case TxoutType::PUBKEY:
        keyID = CPubKey(vSolutions[0]).GetID();
        if (!PermitsUncompressed(sigversion) && vSolutions[0].size() != 33) {
            return IsMineResult::INVALID;
        }
        if (keystore.HaveKey(keyID)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    case TxoutType::WITNESS_V0_KEYHASH:
    {
        if (sigversion == IsMineSigVersion::WITNESS_V0) {
            // P2WPKH inside P2WSH is invalid.
            return IsMineResult::INVALID;
        }
        if (sigversion == IsMineSigVersion::TOP && !keystore.HaveCScript(CScriptID(CScript() << OP_0 << vSolutions[0]))) {
            // We do not support bare witness outputs unless the P2SH version of it would be
            // acceptable as well. This protects against matching before segwit activates.
            // This also applies to the P2WSH case.
            break;
        }
        ret = std::max(ret, IsMineInner(keystore, GetScriptForDestination(PKHash(uint160(vSolutions[0]))), IsMineSigVersion::WITNESS_V0));
        break;
    }
    case TxoutType::PUBKEYHASH:
        keyID = CKeyID(uint160(vSolutions[0]));
        if (!PermitsUncompressed(sigversion)) {
            CPubKey pubkey;
            if (keystore.GetPubKey(keyID, pubkey) && !pubkey.IsCompressed()) {
                return IsMineResult::INVALID;
            }
        }
        if (keystore.HaveKey(keyID)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    case TxoutType::SCRIPTHASH:
    {
        if (sigversion != IsMineSigVersion::TOP) {
            // P2SH inside P2WSH or P2SH is invalid.
            return IsMineResult::INVALID;
        }
        CScriptID scriptID = CScriptID(uint160(vSolutions[0]));
        CScript subscript;
        if (keystore.GetCScript(scriptID, subscript)) {
            ret = std::max(ret, recurse_scripthash ? IsMineInner(keystore, subscript, IsMineSigVersion::P2SH) : IsMineResult::SPENDABLE);
        }
        break;
    }
    case TxoutType::WITNESS_V0_SCRIPTHASH:
    {
        if (sigversion == IsMineSigVersion::WITNESS_V0) {
            // P2WSH inside P2WSH is invalid.
            return IsMineResult::INVALID;
        }
        if (sigversion == IsMineSigVersion::TOP && !keystore.HaveCScript(CScriptID(CScript() << OP_0 << vSolutions[0]))) {
            break;
        }
        CScriptID scriptID{RIPEMD160(vSolutions[0])};
        CScript subscript;
        if (keystore.GetCScript(scriptID, subscript)) {
            ret = std::max(ret, recurse_scripthash ? IsMineInner(keystore, subscript, IsMineSigVersion::WITNESS_V0) : IsMineResult::SPENDABLE);
        }
        break;
    }

    case TxoutType::MULTISIG:
    {
        // Never treat bare multisig outputs as ours (they can still be made watchonly-though)
        if (sigversion == IsMineSigVersion::TOP) {
            break;
        }

        // Only consider transactions "mine" if we own ALL the
        // keys involved. Multi-signature transactions that are
        // partially owned (somebody else has a key that can spend
        // them) enable spend-out-from-under-you attacks, especially
        // in shared-wallet situations.
        std::vector<valtype> keys(vSolutions.begin()+1, vSolutions.begin()+vSolutions.size()-1);
        if (!PermitsUncompressed(sigversion)) {
            for (size_t i = 0; i < keys.size(); i++) {
                if (keys[i].size() != 33) {
                    return IsMineResult::INVALID;
                }
            }
        }
        if (HaveKeys(keys, keystore)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    }
    } // no default case, so the compiler can warn about missing cases

    if (ret == IsMineResult::NO && keystore.HaveWatchOnly(scriptPubKey)) {
        ret = std::max(ret, IsMineResult::WATCH_ONLY);
    }
    return ret;
}